

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O0

void __thiscall
phyr::Timer::TimerLoop<phyr::ProgressReporter::RefreshFunctor>::operator()
          (TimerLoop<phyr::ProgressReporter::RefreshFunctor> *this,
          unique_ptr<phyr::ProgressReporter::RefreshFunctor,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
          *f,int delay)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000L>_> *__rtime;
  type this_00;
  int in_EDX;
  unique_ptr<phyr::ProgressReporter::RefreshFunctor,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
  *in_RSI;
  uint64_t last_call_tstamp;
  uint64_t delta;
  uint64_t elapsed;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  duration<long,std::ratio<1l,1000l>> local_38 [8];
  duration<long,_std::ratio<1L,_1000L>_> *local_30;
  ulong local_28;
  
  local_30 = (duration<long,_std::ratio<1L,_1000L>_> *)
             getElapsedTime((Timer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  while( true ) {
    bVar1 = isActive((Timer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (!bVar1) break;
    __rtime = (duration<long,_std::ratio<1L,_1000L>_> *)
              getElapsedTime((Timer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
    ;
    local_28 = (long)__rtime - (long)local_30;
    if ((ulong)(long)in_EDX <= local_28) {
      local_30 = __rtime;
      this_00 = std::
                unique_ptr<phyr::ProgressReporter::RefreshFunctor,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
                ::operator*(in_RSI);
      ProgressReporter::RefreshFunctor::operator()(this_00);
    }
    in_stack_ffffffffffffffc4 = 0x14;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              (local_38,(int *)&stack0xffffffffffffffc4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(__rtime);
  }
  return;
}

Assistant:

void operator()(std::unique_ptr<Functor> f, int delay, Args... args) {
            uint64_t elapsed, delta;
            uint64_t last_call_tstamp = timer->getElapsedTime();

            while (timer->isActive()) {
                elapsed = timer->getElapsedTime();
                delta = elapsed - last_call_tstamp;

                // Check if elapsed time is more than provided delay
                if (delta >= delay) {
                    // Reset {last_call_tstamp}
                    last_call_tstamp = elapsed;
                    // Call the provided functor
                    (*f)(args...);
                }

                // Sleep to allow for context switches
                std::this_thread::sleep_for(std::chrono::milliseconds(20));
            }
        }